

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O0

Gia_Man_t * Abc_ManReadAig(char *pFileName,char *pToken)

{
  uint nFileSize;
  Vec_Str_t *p;
  char *pcVar1;
  size_t sVar2;
  char *local_48;
  char *pEnd;
  char *pStr;
  Vec_Str_t *vStr;
  Gia_Man_t *pGStack_28;
  uint nBinaryPart;
  Gia_Man_t *pGia;
  char *pToken_local;
  char *pFileName_local;
  
  pGStack_28 = (Gia_Man_t *)0x0;
  p = Abc_ManReadFile(pFileName);
  if (p == (Vec_Str_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    pcVar1 = Vec_StrArray(p);
    pcVar1 = strstr(pcVar1,pToken);
    if (pcVar1 != (char *)0x0) {
      sVar2 = strlen(pToken);
      for (pEnd = pcVar1 + sVar2; *pEnd == ' '; pEnd = pEnd + 1) {
      }
      for (local_48 = pEnd; *local_48 != '\0'; local_48 = local_48 + 1) {
        if ((*local_48 == '\r') || (*local_48 == '\n')) {
          *local_48 = '\0';
          break;
        }
      }
      sVar2 = strlen(pEnd);
      nFileSize = textToBin(pEnd,sVar2);
      pGStack_28 = Gia_AigerReadFromMemory(pEnd,nFileSize,0,0);
    }
    Vec_StrFree(p);
    pFileName_local = (char *)pGStack_28;
  }
  return (Gia_Man_t *)pFileName_local;
}

Assistant:

Gia_Man_t * Abc_ManReadAig( char * pFileName, char * pToken )
{
    Gia_Man_t * pGia = NULL;
    unsigned nBinaryPart;
    Vec_Str_t * vStr;
    char * pStr, * pEnd;
    vStr = Abc_ManReadFile( pFileName );
    if ( vStr == NULL )
        return NULL;
    pStr = Vec_StrArray( vStr );
    pStr = strstr( pStr, pToken );
    if ( pStr != NULL )
    {
        // skip token
        pStr += strlen(pToken);
        // skip spaces
        while ( *pStr == ' ' )
            pStr++;
        // set the end at newline
        for ( pEnd = pStr; *pEnd; pEnd++ )
            if ( *pEnd == '\r' || *pEnd == '\n' )
            {
                *pEnd = 0;
                break;
            }
        // convert into binary AIGER
        nBinaryPart = textToBin( pStr, strlen(pStr) );
        // dump it into file
        if ( 0 )
        {
            FILE * pFile = fopen( "test.aig", "wb" );
            fwrite( pStr, 1, nBinaryPart, pFile );
            fclose( pFile );
        }
        // derive AIG
        pGia = Gia_AigerReadFromMemory( pStr, nBinaryPart, 0, 0 ); 
    }
    Vec_StrFree( vStr );
    return pGia;

}